

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_cast.cpp
# Opt level: O3

string_t duckdb::StringCastTZ::Operation<duckdb::timestamp_t>(timestamp_t input,Vector *vector)

{
  int iVar1;
  undefined **ppuVar2;
  long lVar3;
  idx_t length;
  ulong uVar4;
  long lVar5;
  idx_t len;
  char *data;
  anon_union_16_2_67f50693_for_value aVar6;
  char micro_buffer [6];
  int32_t date [3];
  int32_t time [4];
  date_t date_entry;
  dtime_t time_entry;
  char local_7c [8];
  int local_74;
  int32_t local_70;
  int32_t local_6c;
  int32_t local_68;
  int32_t local_64;
  int32_t local_60;
  int32_t local_5c;
  undefined1 local_58 [16];
  idx_t local_48;
  date_t local_3c;
  dtime_t local_38;
  
  if (input.value == -0x7fffffffffffffff) {
    ppuVar2 = &Date::NINF;
  }
  else {
    if (input.value != 0x7fffffffffffffff) {
      Timestamp::Convert(input,&local_3c,&local_38);
      Date::Convert(local_3c,&local_74,&local_70,&local_6c);
      Time::Convert(local_38,&local_68,&local_64,&local_60,&local_5c);
      iVar1 = local_74;
      local_7c[4] = '\0';
      local_7c[5] = '\0';
      local_7c[0] = '\0';
      local_7c[1] = '\0';
      local_7c[2] = '\0';
      local_7c[3] = '\0';
      lVar3 = 6;
      if (local_74 < 1) {
        local_74 = 1 - local_74;
        lVar3 = 0xb;
      }
      lVar5 = (ulong)(999999 < local_74) + (ulong)(99999 < local_74) + (ulong)(9999 < local_74);
      local_48 = (ulong)(9999999 < local_74) + 4 + lVar5;
      lVar3 = lVar3 + lVar5 + (ulong)(9999999 < local_74) + 4;
      length = TimeToStringCast::MicrosLength(local_5c,local_7c);
      local_58 = (undefined1  [16])
                 StringVector::EmptyString
                           ((StringVector *)vector,(Vector *)(length + lVar3 + 4),len);
      data = local_58._8_8_;
      if (local_58._0_4_ < 0xd) {
        data = local_58 + 4;
      }
      DateToStringCast::Format(data,local_74,local_70,local_6c,local_48,iVar1 < 1);
      data[lVar3] = ' ';
      TimeToStringCast::Format(data + lVar3 + 1,length,local_68,local_64,local_60,local_5c,local_7c)
      ;
      (data + length + lVar3 + 1)[0] = '+';
      (data + length + lVar3 + 1)[1] = '0';
      data[length + lVar3 + 3] = '0';
      uVar4 = (ulong)(uint)local_58._0_4_;
      if (uVar4 < 0xd) {
        switchD_012e3010::default(local_58 + 4 + uVar4,0,0xc - uVar4);
      }
      else {
        local_58._4_4_ = *(undefined4 *)local_58._8_8_;
      }
      aVar6.pointer.ptr = (char *)local_58._8_8_;
      aVar6._0_8_ = local_58._0_8_;
      return (string_t)aVar6;
    }
    ppuVar2 = (undefined **)&Date::PINF;
  }
  aVar6.pointer = (anon_struct_16_3_d7536bce_for_pointer)StringVector::AddString(vector,*ppuVar2);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar6.pointer;
}

Assistant:

string_t StringCastTZ::Operation(timestamp_t input, Vector &vector) {
	if (input == timestamp_t::infinity()) {
		return StringVector::AddString(vector, Date::PINF);
	}
	if (input == timestamp_t::ninfinity()) {
		return StringVector::AddString(vector, Date::NINF);
	}

	date_t date_entry;
	dtime_t time_entry;
	Timestamp::Convert(input, date_entry, time_entry);

	int32_t date[3], time[4];
	Date::Convert(date_entry, date[0], date[1], date[2]);
	Time::Convert(time_entry, time[0], time[1], time[2], time[3]);

	// format for timestamptz is DATE TIME+00 (separated by space)
	idx_t year_length;
	bool add_bc;
	char micro_buffer[6] = {};
	const idx_t date_length = DateToStringCast::Length(date, year_length, add_bc);
	const idx_t time_length = TimeToStringCast::Length(time, micro_buffer);
	const idx_t length = date_length + 1 + time_length + 3;

	string_t result = StringVector::EmptyString(vector, length);
	auto data = result.GetDataWriteable();

	idx_t pos = 0;
	DateToStringCast::Format(data + pos, date, year_length, add_bc);
	pos += date_length;
	data[pos++] = ' ';
	TimeToStringCast::Format(data + pos, time_length, time, micro_buffer);
	pos += time_length;
	data[pos++] = '+';
	data[pos++] = '0';
	data[pos++] = '0';

	result.Finalize();
	return result;
}